

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall UrsaClient::check_conn_status(UrsaClient *this,socket_t *socket)

{
  bool bVar1;
  reference pvVar2;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string_view trace;
  string_view trace_00;
  string_view_t fmt;
  value_type res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> server_status;
  input_adapter local_98;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> res_str;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  res_str._M_dataplus._M_p = (pointer)0x5;
  res_str._M_string_length = (size_type)anon_var_dwarf_f67a;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  trace._M_str = 
  "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/Client.cpp,45)";
  trace._M_len = 0x5f;
  s_send<std::basic_string_view<char,std::char_traits<char>>>
            (socket,(basic_string_view<char,_std::char_traits<char>_> *)&res_str,trace,0);
  trace_00._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/Client.cpp,46)"
  ;
  trace_00._M_len = 0x5f;
  s_recv<std::__cxx11::string>(&res_str,socket,trace_00);
  if (res_str._M_string_length == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Failed to connect to the database!");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_98,&res_str);
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)&server_status,&local_98,(parser_callback_t *)&local_48,true);
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&server_status,"result");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&res,pvVar2);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&server_status);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.ia.
              super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&res,"status");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&server_status,pvVar2);
  bVar1 = std::operator!=(&server_status,"ok");
  if (!bVar1) {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&res,"ursadb_version");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&msg,pvVar2);
    std::__cxx11::string::operator=((string *)&this->server_version,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&res,"connection_id");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&msg,pvVar2);
    std::__cxx11::string::operator=((string *)&this->connection_id,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    if (this->is_interactive == true) {
      fmt.size_ = (size_t)&this->server_version;
      fmt.data_ = (char *)0x2b;
      spdlog::info<std::__cxx11::string,std::__cxx11::string>
                ((spdlog *)"Connected to UrsaDB v{} (connection id: {})",fmt,&this->connection_id,
                 args_1);
    }
    std::__cxx11::string::~string((string *)&server_status);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&res);
    std::__cxx11::string::~string((string *)&res_str);
    return;
  }
  std::operator+(&msg,"Server returned bad status: ",&server_status);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,(string *)&msg);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void UrsaClient::check_conn_status(zmq::socket_t *socket) {
    s_send<std::string_view>(socket, "ping;", ZMQTRACE);
    auto res_str = s_recv<std::string>(socket, ZMQTRACE);

    if (res_str.empty()) {
        throw std::runtime_error("Failed to connect to the database!");
    }

    auto res = json::parse(res_str)["result"];
    auto server_status = res["status"].get<std::string>();

    if (server_status != "ok") {
        std::string msg = "Server returned bad status: " + server_status;
        throw std::runtime_error(msg);
    }

    this->server_version = res["ursadb_version"];
    this->connection_id = res["connection_id"];

    if (this->is_interactive) {
        spdlog::info("Connected to UrsaDB v{} (connection id: {})",
                     server_version, connection_id);
    }
}